

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement_strings.cpp
# Opt level: O0

void __thiscall
MeasurementStrings_basic_Test::~MeasurementStrings_basic_Test(MeasurementStrings_basic_Test *this)

{
  MeasurementStrings_basic_Test *this_local;
  
  ~MeasurementStrings_basic_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MeasurementStrings, basic)
{
    auto pm = measurement_from_string("45 m");
    EXPECT_EQ(pm, 45.0 * precise::m);

    pm = measurement_from_string("9.0 * 5.0 m");
    EXPECT_EQ(pm, 45.0 * precise::m);

    pm = measurement_from_string("23.7 m/s");
    EXPECT_EQ(pm, 23.7 * precise::m / precise::s);
    pm = measurement_from_string("99.9 N * m");
    EXPECT_EQ(pm, 99.9 * precise::N * precise::m);

    EXPECT_NO_THROW(pm = measurement_from_string(""));
    EXPECT_EQ(pm.value(), 0.0);
}